

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimepicker.cpp
# Opt level: O0

void __thiscall QtMWidgets::DateTimePicker::mouseMoveEvent(DateTimePicker *this,QMouseEvent *event)

{
  int iVar1;
  DateTimePickerPrivate *pDVar2;
  QPoint __addr_len;
  sockaddr *__addr;
  QPoint local_24;
  int local_1c;
  QMouseEvent *pQStack_18;
  int delta;
  QMouseEvent *event_local;
  DateTimePicker *this_local;
  
  pQStack_18 = event;
  event_local = (QMouseEvent *)this;
  pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
           ::operator->(&this->d);
  if ((pDVar2->leftMouseButtonPressed & 1U) == 0) {
    QEvent::ignore((QEvent *)pQStack_18);
  }
  else {
    local_24 = QMouseEvent::pos(pQStack_18);
    iVar1 = QPoint::y(&local_24);
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    local_1c = QPoint::y(&pDVar2->mousePos);
    local_1c = iVar1 - local_1c;
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    iVar1 = local_1c;
    DateTimePickerPrivate::updateOffset(pDVar2,local_1c);
    __addr_len = QMouseEvent::pos(pQStack_18);
    pDVar2 = QScopedPointer<QtMWidgets::DateTimePickerPrivate,_QScopedPointerDeleter<QtMWidgets::DateTimePickerPrivate>_>
             ::operator->(&this->d);
    pDVar2->mousePos = __addr_len;
    QWidget::update();
    QEvent::accept((QEvent *)pQStack_18,iVar1,__addr,(socklen_t *)__addr_len);
  }
  return;
}

Assistant:

void
DateTimePicker::mouseMoveEvent( QMouseEvent * event )
{
	if( d->leftMouseButtonPressed )
	{
		const int delta = event->pos().y() - d->mousePos.y();
		d->updateOffset( delta );
		d->mousePos = event->pos();
		update();

		event->accept();
	}
	else
		event->ignore();
}